

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::parseContentStream_internal
          (QPDFObjectHandle *this,string *description,ParserCallbacks *callbacks)

{
  element_type *peVar1;
  size_t sVar2;
  QPDF *context;
  shared_ptr<Buffer> stream_data;
  string all_description;
  Pl_Buffer buf;
  undefined1 local_98 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  string local_78;
  Pl_Buffer local_58;
  
  Pl_Buffer::Pl_Buffer(&local_58,"concatenated stream data buffer",(Pipeline *)0x0);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  pipeContentStreams(this,&local_58.super_Pipeline,description,&local_78);
  Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)local_98);
  sVar2 = Buffer::getSize((Buffer *)local_98._0_8_);
  (*callbacks->_vptr_ParserCallbacks[5])(callbacks,sVar2);
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)(local_98 + 0x10),
             (__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_98);
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    context = (QPDF *)0x0;
  }
  else {
    context = peVar1->qpdf;
  }
  parseContentStream_data((shared_ptr<Buffer> *)(local_98 + 0x10),&local_78,callbacks,context);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  (*callbacks->_vptr_ParserCallbacks[4])(callbacks);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  Pl_Buffer::~Pl_Buffer(&local_58);
  return;
}

Assistant:

void
QPDFObjectHandle::parseContentStream_internal(
    std::string const& description, ParserCallbacks* callbacks)
{
    Pl_Buffer buf("concatenated stream data buffer");
    std::string all_description;
    pipeContentStreams(&buf, description, all_description);
    auto stream_data = buf.getBufferSharedPointer();
    callbacks->contentSize(stream_data->getSize());
    try {
        parseContentStream_data(stream_data, all_description, callbacks, getOwningQPDF());
    } catch (TerminateParsing&) {
        return;
    }
    callbacks->handleEOF();
}